

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

void testing::internal::UniversalTersePrinter<const_wchar_t_*>::Print(wchar_t *str,ostream *os)

{
  ostream *in_RSI;
  ostream *in_RDI;
  allocator *value;
  allocator local_31;
  wstring local_30 [48];
  
  if (in_RDI == (ostream *)0x0) {
    std::operator<<(in_RSI,"NULL");
  }
  else {
    value = &local_31;
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring(local_30,(wchar_t *)in_RDI,value);
    UniversalPrint<std::__cxx11::wstring>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)value,
               in_RDI);
    std::__cxx11::wstring::~wstring(local_30);
    std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)&local_31);
  }
  return;
}

Assistant:

static void Print(const wchar_t* str, ::std::ostream* os) {
    if (str == NULL) {
      *os << "NULL";
    } else {
      UniversalPrint(::std::wstring(str), os);
    }
  }